

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

int observable_depth(d_level *lev)

{
  boolean bVar1;
  schar sVar2;
  d_level *lev_local;
  
  if (lev->dnum == dungeon_topology.d_astral_level.dnum) {
    bVar1 = on_level(lev,&dungeon_topology.d_astral_level);
    if (bVar1 == '\0') {
      bVar1 = on_level(lev,&dungeon_topology.d_water_level);
      if (bVar1 == '\0') {
        bVar1 = on_level(lev,&dungeon_topology.d_fire_level);
        if (bVar1 == '\0') {
          bVar1 = on_level(lev,&dungeon_topology.d_air_level);
          if (bVar1 == '\0') {
            bVar1 = on_level(lev,&dungeon_topology.d_earth_level);
            if (bVar1 == '\0') {
              lev_local._4_4_ = 0;
            }
            else {
              lev_local._4_4_ = -1;
            }
          }
          else {
            lev_local._4_4_ = -2;
          }
        }
        else {
          lev_local._4_4_ = -3;
        }
      }
      else {
        lev_local._4_4_ = -4;
      }
    }
    else {
      lev_local._4_4_ = -5;
    }
  }
  else {
    sVar2 = depth(lev);
    lev_local._4_4_ = (int)sVar2;
  }
  return lev_local._4_4_;
}

Assistant:

static int observable_depth(const d_level *lev)
{
    /* with the order of the elemental planes randomized, we must use a
     * constant external representation in the record file
     */
    if (In_endgame(lev)) {
	if (Is_astralevel(lev))	     return -5;
	else if (Is_waterlevel(lev)) return -4;
	else if (Is_firelevel(lev))  return -3;
	else if (Is_airlevel(lev))   return -2;
	else if (Is_earthlevel(lev)) return -1;
	else			     return 0;	/* ? */
    }
    return depth(lev);
}